

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::ZNames::ZNamesLoader::setNameIfEmpty
          (ZNamesLoader *this,char *key,ResourceValue *value,UErrorCode *errorCode)

{
  UTimeZoneNameTypeIndex UVar1;
  int iVar2;
  undefined4 extraout_var;
  UChar *pUVar3;
  int32_t length;
  undefined1 local_24 [4];
  
  UVar1 = nameTypeFromKey(key);
  if ((UVar1 != UTZNM_INDEX_UNKNOWN) && (this->names[UVar1] == (UChar *)0x0)) {
    if (value == (ResourceValue *)0x0) {
      pUVar3 = L"";
    }
    else {
      iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,local_24,errorCode);
      pUVar3 = (UChar *)CONCAT44(extraout_var,iVar2);
    }
    this->names[UVar1] = pUVar3;
  }
  return;
}

Assistant:

void setNameIfEmpty(const char* key, const ResourceValue* value, UErrorCode& errorCode) {
        UTimeZoneNameTypeIndex type = nameTypeFromKey(key);
        if (type == UTZNM_INDEX_UNKNOWN) { return; }
        if (names[type] == NULL) {
            int32_t length;
            // 'NO_NAME' indicates internally that this field should remain empty.  It will be
            // replaced by 'NULL' in getNames()
            names[type] = (value == NULL) ? NO_NAME : value->getString(length, errorCode);
        }
    }